

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O3

void __thiscall
burst::
intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
::faze(intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
       *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator_range<std::_List_const_iterator<int>_> *piVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  element_type *peVar4;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  iterator_range<std::_List_const_iterator<int>_> *local_48;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  iterator_range<std::_List_const_iterator<int>_> *local_28;
  
  local_38 = (this->m_begin).m_container.
             super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_30._M_pi =
       (this->m_begin).m_container.
       super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_58 = local_38;
  if (local_30._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_48 = (this->m_begin).m_iterator._M_current;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_28 = local_48;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      UNLOCK();
      local_58 = (this->m_begin).m_container.
                 super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      _Stack_50._M_pi =
           (this->m_begin).m_container.
           super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      local_48 = (this->m_begin).m_iterator._M_current;
      local_28 = local_48;
      if (_Stack_50._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00214efc;
    }
    else {
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      local_28 = (this->m_begin).m_iterator._M_current;
      _Stack_50._M_pi = local_30._M_pi;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_50._M_pi)->_M_use_count = (_Stack_50._M_pi)->_M_use_count + 1;
      UNLOCK();
      local_48 = (this->m_begin).m_iterator._M_current;
    }
    else {
      (_Stack_50._M_pi)->_M_use_count = (_Stack_50._M_pi)->_M_use_count + 1;
      local_48 = local_28;
    }
  }
LAB_00214efc:
  if (local_58 ==
      (this->m_end).m_container.
      super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr) {
    do {
      if (local_48 == (this->m_end).m_iterator._M_current) {
        if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
        }
        this_01._M_pi = local_30._M_pi;
        if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
          }
        }
        this_00 = (this->m_end).m_container.
                  super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          piVar3 = (this->m_end).m_iterator._M_current;
          p_Var1 = (local_28->
                   super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                   ).
                   super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                   .m_Begin._M_node;
          _Stack_50._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (local_28->
               super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
               ).
               super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               .m_End._M_node;
          p_Var2 = piVar3[-1].
                   super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                   .m_End._M_node;
          (local_28->
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
          ).
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin._M_node =
               piVar3[-1].
               super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_node;
          (local_28->
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
          ).
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_End._M_node = p_Var2;
          piVar3[-1].
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin._M_node = p_Var1;
          piVar3[-1].
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_End._M_node = (_List_node_base *)_Stack_50._M_pi;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          piVar3 = (this->m_end).m_iterator._M_current;
          p_Var1 = (local_28->
                   super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                   ).
                   super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                   .m_Begin._M_node;
          _Stack_50._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (local_28->
               super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
               ).
               super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               .m_End._M_node;
          p_Var2 = piVar3[-1].
                   super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                   .m_End._M_node;
          (local_28->
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
          ).
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin._M_node =
               piVar3[-1].
               super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_node;
          (local_28->
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
          ).
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_End._M_node = p_Var2;
          piVar3[-1].
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin._M_node = p_Var1;
          piVar3[-1].
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_End._M_node = (_List_node_base *)_Stack_50._M_pi;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
joined_r0x00215056:
        if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
        }
        if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
        }
        return;
      }
      p_Var1 = ((local_48->
                super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                ).
                super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                .m_Begin._M_node)->_M_next;
      (local_48->
      super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
      ).
      super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin._M_node = p_Var1;
      if (p_Var1 == (local_48->
                    super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                    ).
                    super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                    .m_End._M_node) {
        (this->m_end).m_container.
        super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (this->m_begin).m_container.
                  super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(this->m_end).m_container.
                    super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   &(this->m_begin).m_container.
                    super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        (this->m_end).m_iterator._M_current = (this->m_begin).m_iterator._M_current;
        this_01._M_pi = _Stack_50._M_pi;
        goto joined_r0x00215056;
      }
      p_Var2 = (local_28->
               super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
               ).
               super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_node;
      if (p_Var2 == (local_28->
                    super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                    ).
                    super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                    .m_End._M_node) {
        __assert_fail("!empty()","/usr/include/boost/range/iterator_range_core.hpp",0xff,
                      "reference boost::iterator_range_detail::iterator_range_base<std::_List_const_iterator<int>, boost::iterators::incrementable_traversal_tag>::front() const [IteratorT = std::_List_const_iterator<int>, TraversalTag = boost::iterators::incrementable_traversal_tag]"
                     );
      }
      peVar4 = local_58;
      if (*(int *)&p_Var1[1]._M_next < *(int *)&p_Var2[1]._M_next) {
        local_38 = local_58;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_30,&_Stack_50);
        local_28 = local_48;
        peVar4 = (this->m_end).m_container.
                 super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      }
      local_48 = local_48 + 1;
    } while (local_58 == peVar4);
  }
  __assert_fail("this->m_container == that.m_container",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/owning_iterator.hpp"
                ,0x55,
                "bool burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>>>::equal(const owning_iterator<Container> &) const [Container = std::vector<boost::iterator_range<std::_List_const_iterator<int>>>]"
               );
}

Assistant:

void faze ()
        {
            auto max_range = m_begin;
            for (auto range = m_begin; range != m_end; ++range)
            {
                range->advance_begin(1);
                if (range->empty())
                {
                    scroll_to_end();
                    return;
                }
                else if (m_compare(max_range->front(), range->front()))
                {
                    max_range = range;
                }
            }
            std::iter_swap(max_range, std::prev(m_end));
        }